

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_open.c
# Opt level: O0

zip_t * zip_open(char *fn,int _flags,int *zep)

{
  undefined1 local_48 [8];
  zip_error error;
  zip_source_t *src;
  zip_t *za;
  int *zep_local;
  int _flags_local;
  char *fn_local;
  
  zip_error_init((zip_error_t *)local_48);
  error.str = (char *)zip_source_file_create(fn,0,-1,(zip_error_t *)local_48);
  if ((zip_source_t *)error.str == (zip_source_t *)0x0) {
    _zip_set_open_error(zep,(zip_error_t *)local_48,0);
    zip_error_fini((zip_error_t *)local_48);
    fn_local = (char *)0x0;
  }
  else {
    fn_local = (char *)zip_open_from_source
                                 ((zip_source_t *)error.str,_flags,(zip_error_t *)local_48);
    if ((zip_t *)fn_local == (zip_t *)0x0) {
      zip_source_free((zip_source_t *)error.str);
      _zip_set_open_error(zep,(zip_error_t *)local_48,0);
      zip_error_fini((zip_error_t *)local_48);
      fn_local = (char *)0x0;
    }
    else {
      zip_error_fini((zip_error_t *)local_48);
    }
  }
  return (zip_t *)fn_local;
}

Assistant:

ZIP_EXTERN zip_t *
zip_open(const char *fn, int _flags, int *zep) {
    zip_t *za;
    zip_source_t *src;
    struct zip_error error;

    zip_error_init(&error);
    if ((src = zip_source_file_create(fn, 0, -1, &error)) == NULL) {
        _zip_set_open_error(zep, &error, 0);
        zip_error_fini(&error);
        return NULL;
    }

    if ((za = zip_open_from_source(src, _flags, &error)) == NULL) {
        zip_source_free(src);
        _zip_set_open_error(zep, &error, 0);
        zip_error_fini(&error);
        return NULL;
    }

    zip_error_fini(&error);
    return za;
}